

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O2

CURLcode smb_disconnect(connectdata *conn,_Bool dead)

{
  void *pvVar1;
  
  pvVar1 = (conn->data->req).protop;
  (*Curl_cfree)((void *)(conn->proto).ftpc.pp.nread_resp);
  (conn->proto).ftpc.pp.nread_resp = 0;
  (*Curl_cfree)((conn->proto).ftpc.pp.sendthis);
  (conn->proto).ftpc.pp.sendthis = (char *)0x0;
  if (pvVar1 != (void *)0x0) {
    (*Curl_cfree)(*(void **)((long)pvVar1 + 8));
    *(undefined8 *)((long)pvVar1 + 8) = 0;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode smb_disconnect(struct connectdata *conn, bool dead)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  struct smb_request *req = conn->data->req.protop;

  (void) dead;

  Curl_safefree(smbc->domain);
  Curl_safefree(smbc->recv_buf);

  /* smb_done is not always called, so cleanup the request */
  if(req) {
    Curl_safefree(req->share);
  }

  return CURLE_OK;
}